

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O2

type __thiscall
llvm::yaml::yamlize<llvm::DWARFYAML::LineTableOpcode,llvm::yaml::EmptyContext>
          (yaml *this,IO *io,LineTableOpcode *Val,bool param_3,EmptyContext *Ctx)

{
  (**(code **)(*(long *)this + 0x68))();
  MappingTraits<llvm::DWARFYAML::LineTableOpcode>::mapping((IO *)this,(LineTableOpcode *)io);
  (**(code **)(*(long *)this + 0x70))(this);
  return;
}

Assistant:

typename std::enable_if<unvalidatedMappingTraits<T, Context>::value, void>::type
yamlize(IO &io, T &Val, bool, Context &Ctx) {
  if (has_FlowTraits<MappingTraits<T>>::value) {
    io.beginFlowMapping();
    detail::doMapping(io, Val, Ctx);
    io.endFlowMapping();
  } else {
    io.beginMapping();
    detail::doMapping(io, Val, Ctx);
    io.endMapping();
  }
}